

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivCountLits(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int CounterX;
  int Counter0;
  int Counter;
  int i;
  Gia_Man_t *p_local;
  
  CounterX = 0;
  local_28 = 0;
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    p_local._4_4_ = 0;
  }
  else {
    for (Counter0 = 1; iVar1 = Gia_ManObjNum(p), Counter0 < iVar1; Counter0 = Counter0 + 1) {
      iVar1 = Gia_ObjIsHead(p,Counter0);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsConst(p,Counter0);
        if ((iVar1 == 0) && (iVar1 = Gia_ObjIsNone(p,Counter0), iVar1 != 0)) {
          local_28 = local_28 + 1;
        }
      }
      else {
        CounterX = CounterX + 1;
      }
    }
    iVar1 = Gia_ManCoNum(p);
    iVar2 = Gia_ManCiNum(p);
    iVar3 = Gia_ManAndNum(p);
    p_local._4_4_ = ((iVar2 + iVar3) - CounterX) - (local_28 - iVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManEquivCountLits( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
    }
    CounterX -= Gia_ManCoNum(p);
    return Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
}